

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O2

bool __thiscall IntBounds::SetIsNot(IntBounds *this,int constantValue,bool isExplicit)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  
  iVar3 = this->constantLowerBound;
  if (iVar3 != this->constantUpperBound) {
    if (this->constantUpperBound <= iVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                         ,0xf6,"(constantLowerBound < constantUpperBound)",
                         "constantLowerBound < constantUpperBound");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      iVar3 = this->constantLowerBound;
    }
    if (iVar3 == constantValue) {
      this->constantLowerBound = constantValue + 1;
      return true;
    }
    if (this->constantUpperBound == constantValue) {
      this->constantUpperBound = constantValue + -1;
      if (!isExplicit) {
        return true;
      }
      this->wasConstantUpperBoundEstablishedExplicitly = true;
      return true;
    }
  }
  return false;
}

Assistant:

bool IntBounds::SetIsNot(const int constantValue, const bool isExplicit)
{
    if(constantLowerBound == constantUpperBound)
        return false;

    Assert(constantLowerBound < constantUpperBound);
    if(constantValue == constantLowerBound)
    {
        ++constantLowerBound;
        return true;
    }
    if(constantValue == constantUpperBound)
    {
        --constantUpperBound;
        if(isExplicit)
            wasConstantUpperBoundEstablishedExplicitly = true;
        return true;
    }
    return false;
}